

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O2

void __thiscall CTcDataStream::copy_to_buf(CTcDataStream *this,char *buf,ulong start_ofs,ulong len)

{
  ulong __n;
  
  for (; len != 0; len = len - __n) {
    __n = 65000 - start_ofs % 65000;
    if (len <= __n) {
      __n = len;
    }
    memcpy(buf,this->pages_[start_ofs / 65000] + start_ofs % 65000,__n);
    start_ofs = start_ofs + __n;
    buf = buf + __n;
  }
  return;
}

Assistant:

void CTcDataStream::copy_to_buf(char *buf, ulong start_ofs, ulong len)
{
    /* read the data from each page that the block spans */
    while (len != 0)
    {
        size_t cur;
        
        /* 
         *   determine how much is left on the page containing the current
         *   starting offset 
         */
        cur = TCCS_PAGE_SIZE - (start_ofs % TCCS_PAGE_SIZE);
        
        /* 
         *   figure out how much we can copy - copy the whole remaining
         *   size, but no more than the amount remaining on this page 
         */
        if (cur > len)
            cur = (size_t)len;

        /* copy the data */
        memcpy(buf, calc_addr(start_ofs), cur);

        /* advance past this chunk */
        len -= cur;
        start_ofs += cur;
        buf += cur;
    }
}